

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cPipelineStatisticsQueryTests.cpp
# Opt level: O0

void __thiscall
glcts::PipelineStatisticsQueryTestFunctional3::getExpectedVerticesSubmittedQueryResult
          (PipelineStatisticsQueryTestFunctional3 *this,_primitive_type current_primitive_type,
          uint *out_results_written,GLuint64 *out_results)

{
  uint uVar1;
  bool bVar2;
  TestError *this_00;
  uint local_40;
  uint i;
  uint local_2c;
  uint n_input_vertices;
  GLuint64 *out_results_local;
  uint *out_results_written_local;
  _primitive_type current_primitive_type_local;
  PipelineStatisticsQueryTestFunctional3 *this_local;
  
  local_2c = (this->super_PipelineStatisticsQueryTestFunctionalBase).
             m_indirect_draw_call_count_argument;
  *out_results_written = 0;
  if ((this->m_is_primitive_restart_enabled & 1U) != 0) {
    local_2c = local_2c - 1;
  }
  switch(current_primitive_type) {
  case PRIMITIVE_TYPE_FIRST:
  case PRIMITIVE_TYPE_LINE_STRIP:
  case PRIMITIVE_TYPE_TRIANGLE_FAN:
  case PRIMITIVE_TYPE_TRIANGLE_STRIP:
    uVar1 = *out_results_written;
    *out_results_written = uVar1 + 1;
    out_results[uVar1] = (ulong)local_2c;
    break;
  case PRIMITIVE_TYPE_LINE_LOOP:
    uVar1 = *out_results_written;
    *out_results_written = uVar1 + 1;
    out_results[uVar1] = (ulong)local_2c;
    uVar1 = *out_results_written;
    *out_results_written = uVar1 + 1;
    out_results[uVar1] = (ulong)(local_2c + 1);
    break;
  case PRIMITIVE_TYPE_LINES:
    uVar1 = *out_results_written;
    *out_results_written = uVar1 + 1;
    out_results[uVar1] = (ulong)local_2c;
    if ((local_2c != 0) && ((local_2c & 1) != 0)) {
      uVar1 = *out_results_written;
      *out_results_written = uVar1 + 1;
      out_results[uVar1] = (ulong)(local_2c - 1);
    }
    break;
  case PRIMITIVE_TYPE_LINES_ADJACENCY:
    uVar1 = *out_results_written;
    *out_results_written = uVar1 + 1;
    out_results[uVar1] = (ulong)local_2c;
    uVar1 = *out_results_written;
    *out_results_written = uVar1 + 1;
    out_results[uVar1] = (ulong)(local_2c >> 1);
    if ((local_2c != 0) && ((local_2c & 3) != 0)) {
      uVar1 = *out_results_written;
      *out_results_written = uVar1 + 1;
      out_results[uVar1] = (ulong)(local_2c - (local_2c & 3));
      uVar1 = *out_results_written;
      *out_results_written = uVar1 + 1;
      out_results[uVar1] = (ulong)(local_2c - (local_2c & 3) >> 1);
    }
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Unrecognized primitive type",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cPipelineStatisticsQueryTests.cpp"
               ,0xd82);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  case PRIMITIVE_TYPE_TRIANGLES:
    uVar1 = *out_results_written;
    *out_results_written = uVar1 + 1;
    out_results[uVar1] = (ulong)local_2c;
    if ((local_2c != 0) && (local_2c % 3 != 0)) {
      uVar1 = *out_results_written;
      *out_results_written = uVar1 + 1;
      out_results[uVar1] = (ulong)(local_2c - local_2c % 3);
    }
    break;
  case PRIMITIVE_TYPE_TRIANGLES_ADJACENCY:
    uVar1 = *out_results_written;
    *out_results_written = uVar1 + 1;
    out_results[uVar1] = (ulong)local_2c;
    uVar1 = *out_results_written;
    *out_results_written = uVar1 + 1;
    out_results[uVar1] = (ulong)(local_2c >> 1);
    if ((local_2c != 0) && (local_2c % 6 != 0)) {
      uVar1 = *out_results_written;
      *out_results_written = uVar1 + 1;
      out_results[uVar1] = (ulong)(local_2c - local_2c % 6);
      uVar1 = *out_results_written;
      *out_results_written = uVar1 + 1;
      out_results[uVar1] = (ulong)(local_2c - local_2c % 6 >> 1);
    }
  }
  bVar2 = PipelineStatisticsQueryUtilities::isInstancedDrawCall
                    ((this->super_PipelineStatisticsQueryTestFunctionalBase).
                     m_current_draw_call_type);
  if (bVar2) {
    for (local_40 = 0; local_40 < *out_results_written; local_40 = local_40 + 1) {
      out_results[local_40] =
           (ulong)(this->super_PipelineStatisticsQueryTestFunctionalBase).
                  m_indirect_draw_call_primcount_argument * out_results[local_40];
    }
  }
  return;
}

Assistant:

void PipelineStatisticsQueryTestFunctional3::getExpectedVerticesSubmittedQueryResult(
	PipelineStatisticsQueryUtilities::_primitive_type current_primitive_type, unsigned int* out_results_written,
	glw::GLuint64 out_results[4])
{
	unsigned int n_input_vertices = m_indirect_draw_call_count_argument;

	*out_results_written = 0;

	/* Sanity checks */
	DE_ASSERT(current_primitive_type != PipelineStatisticsQueryUtilities::PRIMITIVE_TYPE_PATCHES);

	/* Carry on */
	if (m_is_primitive_restart_enabled)
	{
		/* Primitive restart functionality in our test removes a single index.
		 *
		 * Note: This also applies to arrayed draw calls, since we're testing
		 *       GL_PRIMITIVE_RESTART rendering mode, and we're using a primitive
		 *       restart index of 0.
		 **/
		n_input_vertices--;
	}

	switch (current_primitive_type)
	{
	case PipelineStatisticsQueryUtilities::PRIMITIVE_TYPE_POINTS:
	case PipelineStatisticsQueryUtilities::PRIMITIVE_TYPE_LINE_STRIP:
	case PipelineStatisticsQueryUtilities::PRIMITIVE_TYPE_TRIANGLE_FAN:
	case PipelineStatisticsQueryUtilities::PRIMITIVE_TYPE_TRIANGLE_STRIP:
	{
		out_results[(*out_results_written)++] = n_input_vertices;

		break;
	}

	case PipelineStatisticsQueryUtilities::PRIMITIVE_TYPE_LINE_LOOP:
	{
		out_results[(*out_results_written)++] = n_input_vertices;

		/* Allow line loops to count the first vertex twice as that vertex
		 * is part of both the first and the last primitives.
		 */
		out_results[(*out_results_written)++] = n_input_vertices + 1;
		break;
	}

	case PipelineStatisticsQueryUtilities::PRIMITIVE_TYPE_LINES:
	{
		out_results[(*out_results_written)++] = n_input_vertices;

		/* If the submitted line is incomplete, also include the case where
		 * the incomplete line's vertices are not counted.
		 */
		if (n_input_vertices > 0 && (n_input_vertices % 2) != 0)
		{
			out_results[(*out_results_written)++] = n_input_vertices - 1;
		}

		break;
	}

	case PipelineStatisticsQueryUtilities::PRIMITIVE_TYPE_LINES_ADJACENCY:
	{
		/* Allow implementations to both include or exclude the adjacency
		 * vertices.
		 */
		out_results[(*out_results_written)++] = n_input_vertices;
		out_results[(*out_results_written)++] = n_input_vertices / 2;

		/* If the submitted line is incomplete, also include the case where
		 * the incomplete line's vertices are not counted.
		 */
		if (n_input_vertices > 0 && (n_input_vertices % 4) != 0)
		{
			out_results[(*out_results_written)++] = n_input_vertices - (n_input_vertices % 4);
			out_results[(*out_results_written)++] = (n_input_vertices - (n_input_vertices % 4)) / 2;
		}

		break;
	}

	case PipelineStatisticsQueryUtilities::PRIMITIVE_TYPE_TRIANGLES:
	{
		out_results[(*out_results_written)++] = n_input_vertices;

		/* If the submitted triangle is incomplete, also include the case
		 * when the incomplete triangle's vertices are not counted.
		 */
		if (n_input_vertices > 0 && (n_input_vertices % 3) != 0)
		{
			out_results[(*out_results_written)++] = n_input_vertices - (n_input_vertices % 3);
		}

		break;
	}

	case PipelineStatisticsQueryUtilities::PRIMITIVE_TYPE_TRIANGLES_ADJACENCY:
	{
		/* Allow implementations to both include or exclude the adjacency
		 * vertices.
		 */
		out_results[(*out_results_written)++] = n_input_vertices;
		out_results[(*out_results_written)++] = n_input_vertices / 2;

		/* If the submitted triangle is incomplete, also include the case
		 * when the incomplete triangle's vertices are not counted.
		 */
		if (n_input_vertices > 0 && (n_input_vertices % 6) != 0)
		{
			out_results[(*out_results_written)++] = n_input_vertices - (n_input_vertices % 6);
			out_results[(*out_results_written)++] = (n_input_vertices - (n_input_vertices % 6)) / 2;
		}

		break;
	}

	default:
	{
		TCU_FAIL("Unrecognized primitive type");
	}
	} /* switch (current_primitive_type) */

	if (PipelineStatisticsQueryUtilities::isInstancedDrawCall(m_current_draw_call_type))
	{
		for (unsigned int i = 0; i < *out_results_written; ++i)
		{
			out_results[i] *= m_indirect_draw_call_primcount_argument;
		}
	} /* if (instanced draw call type) */
}